

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ps_image.cxx
# Opt level: O1

void __thiscall
Fl_PostScript_Graphics_Driver::draw_image_mono
          (Fl_PostScript_Graphics_Driver *this,uchar *data,int ix,int iy,int iw,int ih,int D,int LD)

{
  int iVar1;
  byte bVar2;
  byte bVar3;
  byte bVar4;
  double dVar5;
  double dVar6;
  int iVar7;
  byte b;
  int iVar8;
  undefined8 *data_00;
  void *pvVar9;
  ulong uVar10;
  long lVar11;
  char *pcVar12;
  int iVar13;
  byte *pbVar14;
  uchar *puVar15;
  undefined4 uVar16;
  double dVar17;
  byte *local_50;
  uint local_48;
  
  dVar5 = (double)iw;
  dVar6 = (double)ih;
  fwrite("save\n",5,1,(FILE *)this->output);
  uVar16 = SUB84((double)ix,0);
  if (this->lang_level_ < 2) {
    fprintf((FILE *)this->output,"%g %g %g %g %i %i GI",uVar16,(double)iy + dVar6,dVar5,-dVar6,
            (ulong)(uint)iw,ih);
  }
  else {
    pcVar12 = "true";
    if (this->interpolate_ == 0) {
      pcVar12 = "false";
    }
    dVar17 = (double)iy + dVar6;
    if ((this->lang_level_ == 2) || (this->mask == (uchar *)0x0)) {
      fprintf((FILE *)this->output,"%g %g %g %g %i %i %s GII\n",uVar16,dVar17,dVar5,-dVar6,
              (ulong)(uint)iw,ih);
    }
    else {
      fprintf((FILE *)this->output,"%g %g %g %g %i %i %i %i %s GIM\n",uVar16,dVar17,dVar5,-dVar6,
              (ulong)(uint)iw,ih,(ulong)(uint)this->mx,(ulong)(uint)this->my,pcVar12);
    }
  }
  bVar2 = this->bg_r;
  bVar3 = this->bg_g;
  bVar4 = this->bg_b;
  puVar15 = this->mask;
  data_00 = (undefined8 *)operator_new(0x90);
  data_00[0x11] = 0;
  pvVar9 = operator_new(0x14);
  *(undefined8 *)((long)pvVar9 + 4) = 0;
  *data_00 = pvVar9;
  if (0 < ih) {
    iVar7 = D * iw;
    if (LD != 0) {
      iVar7 = LD;
    }
    local_50 = data + 1;
    uVar10 = 0;
    do {
      if ((this->mask != (uchar *)0x0) && (0 < this->my / ih)) {
        iVar13 = 0;
        do {
          if (0 < this->mx) {
            lVar11 = 0;
            do {
              write_rle85(this,""[puVar15[lVar11] & 0xf] << 4 | ""[puVar15[lVar11] >> 4],data_00);
              iVar1 = this->mx + 7;
              iVar8 = this->mx + 0xe;
              if (-1 < iVar1) {
                iVar8 = iVar1;
              }
              lVar11 = lVar11 + 1;
            } while ((int)lVar11 < iVar8 >> 3);
            puVar15 = puVar15 + lVar11;
          }
          iVar13 = iVar13 + 1;
        } while (iVar13 < this->my / ih);
      }
      pbVar14 = local_50;
      iVar13 = iw;
      if (0 < iw) {
        do {
          b = pbVar14[-1];
          if ((1 < D) && (this->lang_level_ < 3)) {
            local_48 = ((uint)bVar3 + (uint)bVar2 + (uint)bVar4) / 3;
            b = (byte)(((*pbVar14 ^ 0xff) * local_48 + (uint)b * (uint)*pbVar14) / 0xff);
          }
          write_rle85(this,b,data_00);
          iVar13 = iVar13 + -1;
          pbVar14 = pbVar14 + D;
        } while (iVar13 != 0);
      }
      uVar10 = uVar10 + 1;
      local_50 = local_50 + iVar7;
    } while (uVar10 != (uint)ih);
  }
  close_rle85(this,data_00);
  fwrite("restore\n",8,1,(FILE *)this->output);
  return;
}

Assistant:

void Fl_PostScript_Graphics_Driver::draw_image_mono(const uchar *data, int ix, int iy, int iw, int ih, int D, int LD) {
  double x = ix, y = iy, w = iw, h = ih;

  fprintf(output,"save\n");

  int i,j, k;

  const char * interpol;
  if (lang_level_>1){
    if (interpolate_)
      interpol="true";
    else
      interpol="false";
    if (mask && lang_level_>2)
      fprintf(output, "%g %g %g %g %i %i %i %i %s GIM\n", x , y+h , w , -h , iw , ih, mx, my, interpol);
    else
      fprintf(output, "%g %g %g %g %i %i %s GII\n", x , y+h , w , -h , iw , ih, interpol);
  }else
    fprintf(output , "%g %g %g %g %i %i GI", x , y+h , w , -h , iw , ih);


  if (!LD) LD = iw*D;


  int bg = (bg_r + bg_g + bg_b)/3;

  uchar *curmask=mask;
  void *big = prepare_rle85();
  for (j=0; j<ih;j++){
    if (mask){
      for (k=0;k<my/ih;k++){
        for (i=0; i<((mx+7)/8);i++){
          write_rle85(swap_byte(*curmask), big);
          curmask++;
        }
      }
    }
    const uchar *curdata=data+j*LD;
    for (i=0 ; i<iw ; i++) {
      uchar r = curdata[0];
      if (lang_level_<3 && D>1) { //can do  mixing

        unsigned int a2 = curdata[1]; //must be int
        unsigned int a = 255-a2;
        r = (a2 * r + bg * a)/255;
      }
      write_rle85(r, big);
      curdata +=D;
    }

  }
  close_rle85(big);
  fprintf(output,"restore\n");
}